

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O3

bool __thiscall EventHandler::vector3Moved(EventHandler *this,JoyStickEvent *arg,int index)

{
  ostream *poVar1;
  long lVar2;
  
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) = 2;
  *(undefined4 *)(usleep + *(long *)(lVar2 + -0x18)) = 0x84;
  std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + '@');
  std::ostream::put('@');
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)(*(long *)(arg + 8) + 8),*(long *)(*(long *)(arg + 8) + 0x10)
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,". Orientation # ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," X Value: ",10);
  lVar2 = (long)index * 0x10;
  poVar1 = std::ostream::_M_insert<double>
                     ((double)*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 4 + lVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Y Value: ",10);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 8 + lVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Z Value: ",10);
  std::ostream::_M_insert<double>
            ((double)*(float *)(*(long *)(*(long *)(arg + 0x10) + 0x90) + 0xc + lVar2));
  return true;
}

Assistant:

bool vector3Moved(const JoyStickEvent& arg, int index)
	{
		std::cout.precision(2);
		std::cout.flags(std::ios::fixed | std::ios::right);
		std::cout << std::endl
				  << arg.device->vendor() << ". Orientation # " << index
				  << " X Value: " << arg.state.mVectors[index].x
				  << " Y Value: " << arg.state.mVectors[index].y
				  << " Z Value: " << arg.state.mVectors[index].z;
		std::cout.precision();
		std::cout.flags();
		return true;
	}